

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int peekInternal(uint8_t distance)

{
  Expansion *pEVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  LexerState *pLVar6;
  ulong uVar7;
  size_t nbChars;
  ulong nbChars_00;
  
  for (pEVar1 = lexerState->expansions; pEVar1 != (Expansion *)0x0; pEVar1 = pEVar1->parent) {
    uVar7 = pEVar1->offset;
    uVar3 = pEVar1->size - uVar7;
    if (pEVar1->size < uVar7) {
      __assert_fail("exp->offset <= exp->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x330,"peekInternal");
    }
    if (distance < uVar3) {
      return (int)(pEVar1->contents).unowned[distance + uVar7];
    }
    distance = distance - (char)uVar3;
  }
  if (0x29 < distance) {
    fatalerror("Internal lexer error: buffer has insufficient size for peeking (%u >= %u)\n",
               (ulong)distance,0x2a);
  }
  uVar7 = (ulong)distance;
  if (lexerState->isMmapped == true) {
    uVar7 = uVar7 + (lexerState->field_2).field_0.offset;
    if ((lexerState->field_2).field_0.size <= uVar7) {
      return -1;
    }
    return (uint)(byte)(lexerState->field_2).field_0.ptr[uVar7];
  }
  uVar3 = (lexerState->field_2).field_1.nbChars;
  pLVar6 = lexerState;
  if (uVar7 < uVar3) goto LAB_0010e99a;
  nbChars = 0x2a - uVar3;
  sVar5 = (uVar3 + (lexerState->field_2).field_0.size) % 0x2a;
  if (sVar5 + nbChars < 0x2b) {
LAB_0010e976:
    sVar5 = readInternal(sVar5,nbChars);
    pLVar6 = lexerState;
    uVar3 = sVar5 + (lexerState->field_2).field_1.nbChars;
    (lexerState->field_2).field_1.nbChars = uVar3;
  }
  else {
    nbChars_00 = 0x2a - sVar5;
    sVar2 = readInternal(sVar5,nbChars_00);
    pLVar6 = lexerState;
    uVar3 = (lexerState->field_2).field_1.nbChars + sVar2;
    (lexerState->field_2).field_1.nbChars = uVar3;
    sVar4 = sVar5 + sVar2;
    sVar5 = 0;
    if (sVar4 != 0x2a) {
      sVar5 = sVar4;
    }
    if ((nbChars_00 <= sVar2) && (nbChars = nbChars - sVar2, nbChars != 0)) goto LAB_0010e976;
  }
  if (uVar3 <= uVar7) {
    return -1;
  }
LAB_0010e99a:
  return (uint)*(byte *)((long)&pLVar6->field_2 +
                        (uVar7 + (pLVar6->field_2).field_0.size) % 0x2a + 0x10);
}

Assistant:

static int peekInternal(uint8_t distance)
{
	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// An expansion that has reached its end will have `exp->offset` == `exp->size`,
		// and `peekInternal` will continue with its parent
		assert(exp->offset <= exp->size);
		if (distance < exp->size - exp->offset)
			return exp->contents.unowned[exp->offset + distance];
		distance -= exp->size - exp->offset;
	}

	if (distance >= LEXER_BUF_SIZE)
		fatalerror("Internal lexer error: buffer has insufficient size for peeking (%"
			   PRIu8 " >= %u)\n", distance, LEXER_BUF_SIZE);

	if (lexerState->isMmapped) {
		if (lexerState->offset + distance >= lexerState->size)
			return EOF;

		return (unsigned char)lexerState->ptr[lexerState->offset + distance];
	}

	if (lexerState->nbChars <= distance) {
		// Buffer isn't full enough, read some chars in
		size_t target = LEXER_BUF_SIZE - lexerState->nbChars; // Aim: making the buf full

		// Compute the index we'll start writing to
		size_t writeIndex = (lexerState->index + lexerState->nbChars) % LEXER_BUF_SIZE;

		// If the range to fill passes over the buffer wrapping point, we need two reads
		if (writeIndex + target > LEXER_BUF_SIZE) {
			size_t nbExpectedChars = LEXER_BUF_SIZE - writeIndex;
			size_t nbReadChars = readInternal(writeIndex, nbExpectedChars);

			lexerState->nbChars += nbReadChars;

			writeIndex += nbReadChars;
			if (writeIndex == LEXER_BUF_SIZE)
				writeIndex = 0;

			// If the read was incomplete, don't perform a second read
			target -= nbReadChars;
			if (nbReadChars < nbExpectedChars)
				target = 0;
		}
		if (target != 0)
			lexerState->nbChars += readInternal(writeIndex, target);

		// If there aren't enough chars even after refilling, give up
		if (lexerState->nbChars <= distance)
			return EOF;
	}

	return (unsigned char)lexerState->buf[(lexerState->index + distance) % LEXER_BUF_SIZE];
}